

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codepage.cpp
# Opt level: O1

string * booster::locale::conv::impl::convert_from<wchar_t>
                   (string *__return_storage_ptr__,wchar_t *begin,wchar_t *end,char *charset,
                   method_type how)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  long *plVar4;
  invalid_charset_error *this;
  pointer __old_p;
  allocator local_61;
  wchar_t *local_60;
  wchar_t *local_58;
  string local_50;
  
  local_60 = begin;
  local_58 = end;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = 0;
  plVar3[1] = 0;
  plVar3[2] = 0;
  *plVar3 = (long)&PTR_open_001d0938;
  plVar3[1] = -1;
  bVar1 = iconverter_base::do_open((iconverter_base *)(plVar3 + 1),charset,"UTF-32LE",how);
  if (bVar1) {
    (**(code **)(*plVar3 + 8))(__return_storage_ptr__,plVar3,local_60,local_58);
    plVar4 = plVar3;
  }
  else {
    plVar4 = (long *)operator_new(0x18);
    *plVar4 = 0;
    plVar4[1] = 0;
    plVar4[2] = 0;
    *plVar4 = (long)&PTR_open_001d0990;
    plVar4[1] = 0;
    plVar4[2] = 0;
    (**(code **)(*plVar3 + 0x18))(plVar3);
    cVar2 = (**(code **)*plVar4)(plVar4,charset,how);
    if (cVar2 == '\0') {
      this = (invalid_charset_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_50,charset,&local_61);
      invalid_charset_error::invalid_charset_error(this,&local_50);
      __cxa_throw(this,&invalid_charset_error::typeinfo,runtime_error::~runtime_error);
    }
    (**(code **)(*plVar4 + 8))(__return_storage_ptr__,plVar4,local_60,local_58);
  }
  (**(code **)(*plVar4 + 0x18))(plVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string convert_from(
                                        CharType const *begin,
                                        CharType const *end,
                                        char const *charset,
                                        method_type how)
                {
                    std::unique_ptr<converter_from_utf<CharType> > cvt;
                    #ifdef BOOSTER_LOCALE_WITH_ICONV
                    cvt.reset(new iconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_ICU
                    cvt.reset(new uconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_WCONV
                    cvt.reset(new wconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    throw invalid_charset_error(charset);
                }